

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_types.cpp
# Opt level: O1

shared_ptr<duckdb::ExtraTypeInfo,_true> __thiscall
duckdb::ArrayTypeInfo::Deserialize(ArrayTypeInfo *this,Deserializer *deserializer)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  int iVar2;
  uint32_t size_p;
  ArrayTypeInfo *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<duckdb::ExtraTypeInfo,_true> sVar3;
  LogicalType child_type;
  shared_ptr<duckdb::ArrayTypeInfo,_true> result;
  LogicalType local_70;
  ArrayTypeInfo *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_50 [2];
  LogicalType local_40;
  
  (*deserializer->_vptr_Deserializer[2])(deserializer,200,"child_type");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  LogicalType::Deserialize(&local_70,deserializer);
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  iVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xc9,"size");
  if ((char)iVar2 == '\0') {
    size_p = 0;
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
  }
  else {
    size_p = (*deserializer->_vptr_Deserializer[0x13])(deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  this_00 = (ArrayTypeInfo *)operator_new(0x58);
  LogicalType::LogicalType(&local_40,&local_70);
  ArrayTypeInfo(this_00,&local_40,size_p);
  local_58 = this_00;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<duckdb::ArrayTypeInfo*>
            (a_Stack_50,this_00);
  LogicalType::~LogicalType(&local_40);
  _Var1._M_pi = a_Stack_50[0]._M_pi;
  *(undefined8 *)&(this->super_ExtraTypeInfo).type = 0;
  a_Stack_50[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_ExtraTypeInfo)._vptr_ExtraTypeInfo = (_func_int **)local_58;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(this->super_ExtraTypeInfo).type = _Var1._M_pi;
  LogicalType::~LogicalType(&local_70);
  sVar3.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar3.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_ExtraTypeInfo;
  return (shared_ptr<duckdb::ExtraTypeInfo,_true>)
         sVar3.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<ExtraTypeInfo> ArrayTypeInfo::Deserialize(Deserializer &deserializer) {
	auto child_type = deserializer.ReadProperty<LogicalType>(200, "child_type");
	auto size = deserializer.ReadPropertyWithDefault<uint32_t>(201, "size");
	auto result = duckdb::shared_ptr<ArrayTypeInfo>(new ArrayTypeInfo(std::move(child_type), size));
	return std::move(result);
}